

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_datablobsources.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  uint uVar5;
  uint32_t count;
  hrgls_API api;
  hrgls_APICreateParams params;
  char *name;
  hrgls_APIDataBlobSourceInfo dbsInfo;
  
  iVar2 = hrgls_APICreateParametersCreate(&params);
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = hrgls_APICreate(&api,params);
    pFVar1 = _stderr;
    if (iVar2 == 0) {
      iVar2 = hrgls_APICreateParametersDestroy(params);
      pFVar1 = _stderr;
      if (iVar2 == 0) {
        iVar2 = hrgls_APIGetAvailableDataBlobSourceCount(api,&count);
        pFVar1 = _stderr;
        if (iVar2 == 0) {
          printf("Found %d DataBlobSources\n",(ulong)count);
          for (uVar5 = 0; uVar5 < count; uVar5 = uVar5 + 1) {
            iVar2 = hrgls_APIGetAvailableDataBlobSourceInfo(api,uVar5,&dbsInfo);
            pFVar1 = _stderr;
            if (iVar2 != 0) {
              uVar4 = hrgls_ErrorMessage(iVar2);
              fprintf(pFVar1,"Could not get DataBlobSource info for DataBlobSource %d: %s\n",
                      (ulong)uVar5,uVar4);
              return 0x12d;
            }
            iVar2 = hrgls_APIDataBlobSourceGetName(dbsInfo,&name);
            pFVar1 = _stderr;
            if (iVar2 != 0) {
              uVar4 = hrgls_ErrorMessage(iVar2);
              fprintf(pFVar1,"Could not get DataBlobSource name for DataBlobSource %d: %s\n",
                      (ulong)uVar5,uVar4);
              return 0x12e;
            }
            printf(" DataBlobSource name: %s\n",name);
          }
          iVar3 = hrgls_APIDestroy(api);
          pFVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = hrgls_ErrorMessage();
            fprintf(pFVar1,"Could not destroy API with default parameters: %s\n",uVar4);
            iVar2 = 0x14;
          }
        }
        else {
          uVar4 = hrgls_ErrorMessage(iVar2);
          fprintf(pFVar1,"Could not get number of available DataBlobSources: %s\n",uVar4);
          iVar2 = 3;
        }
      }
      else {
        uVar4 = hrgls_ErrorMessage(iVar2);
        fprintf(pFVar1,"Could not destroy API open parameters: %s\n",uVar4);
        iVar2 = 1000;
      }
    }
    else {
      uVar4 = hrgls_ErrorMessage(iVar2);
      fprintf(pFVar1,"Could not create API with default parameters: %s\n",uVar4);
      iVar2 = 2;
    }
  }
  else {
    uVar4 = hrgls_ErrorMessage(iVar2);
    fprintf(pFVar1,"Could not create API open parameters: %s\n",uVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object, specifying default parameters.
  hrgls_Status status;
  hrgls_APICreateParams params;
  status = hrgls_APICreateParametersCreate(&params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1;
  }

  hrgls_API api;
  status = hrgls_APICreate(&api, params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not create API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 2;
  }
  status = hrgls_APICreateParametersDestroy(params);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API open parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 1000;
  }

  // Find out how many DataBlobSources are in the system, which will also latch the data
  // on the DataBlobSources.
  uint32_t count;
  if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceCount(api, &count))) {
    fprintf(stderr, "Could not get number of available DataBlobSources: %s\n",
      hrgls_ErrorMessage(status));
    return 3;
  }
  printf("Found %d DataBlobSources\n", count);

  // Read each DataBlobSource's information.
  for (uint32_t i = 0; i < count; i++) {
    hrgls_APIDataBlobSourceInfo dbsInfo;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIGetAvailableDataBlobSourceInfo(api, i, &dbsInfo))) {
      fprintf(stderr, "Could not get DataBlobSource info for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 301;
    }

    // Get and print the DataBlobSource name.
    const char *name;
    if (hrgls_STATUS_OKAY != (status = hrgls_APIDataBlobSourceGetName(dbsInfo, &name))) {
      fprintf(stderr, "Could not get DataBlobSource name for DataBlobSource %d: %s\n", i,
        hrgls_ErrorMessage(status));
      return 302;
    }
    printf(" DataBlobSource name: %s\n", name);
  }

  status = hrgls_APIDestroy(api);
  if (status != hrgls_STATUS_OKAY) {
    fprintf(stderr, "Could not destroy API with default parameters: %s\n",
      hrgls_ErrorMessage(status));
    return 20;
  }

  return 0;
}